

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyCutTrav.c
# Opt level: O3

void Ivy_NodeComputeVolume2(Ivy_Obj_t *pObj,int nNodeLimit,Vec_Ptr_t *vNodes,Vec_Ptr_t *vFront)

{
  uint *puVar1;
  int iVar2;
  long lVar3;
  uint uVar4;
  void **ppvVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  void *pvVar10;
  void *pvVar11;
  uint uVar12;
  
  if ((*(uint *)&pObj->field_0x8 & 0xf) - 7 < 0xfffffffe) {
    __assert_fail("Ivy_ObjIsNode(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyCutTrav.c"
                  ,0x11a,"void Ivy_NodeComputeVolume2(Ivy_Obj_t *, int, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  vNodes->nSize = 0;
  vFront->nSize = 0;
  pObj->field_0x8 = pObj->field_0x8 | 0x10;
  uVar7 = vNodes->nSize;
  if (uVar7 == vNodes->nCap) {
    if ((int)uVar7 < 0x10) {
      if (vNodes->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(vNodes->pArray,0x80);
      }
      vNodes->pArray = ppvVar5;
      vNodes->nCap = 0x10;
    }
    else {
      if (vNodes->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar7 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(vNodes->pArray,(ulong)uVar7 << 4);
      }
      vNodes->pArray = ppvVar5;
      vNodes->nCap = uVar7 * 2;
    }
  }
  else {
    ppvVar5 = vNodes->pArray;
  }
  iVar2 = vNodes->nSize;
  vNodes->nSize = iVar2 + 1;
  ppvVar5[iVar2] = pObj;
  uVar7 = vFront->nSize;
  if (uVar7 == vFront->nCap) {
    if ((int)uVar7 < 0x10) {
      if (vFront->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc(0x80);
      }
      else {
        ppvVar5 = (void **)realloc(vFront->pArray,0x80);
      }
      vFront->pArray = ppvVar5;
      vFront->nCap = 0x10;
    }
    else {
      if (vFront->pArray == (void **)0x0) {
        ppvVar5 = (void **)malloc((ulong)uVar7 << 4);
      }
      else {
        ppvVar5 = (void **)realloc(vFront->pArray,(ulong)uVar7 << 4);
      }
      vFront->pArray = ppvVar5;
      vFront->nCap = uVar7 * 2;
    }
  }
  else {
    ppvVar5 = vFront->pArray;
  }
  iVar2 = vFront->nSize;
  uVar7 = iVar2 + 1;
  vFront->nSize = uVar7;
  ppvVar5[iVar2] = pObj;
  uVar12 = *(uint *)&pObj->field_0x8 >> 0xb;
  do {
    uVar8 = (ulong)uVar7;
    do {
      if ((int)uVar8 < 1) {
        uVar12 = uVar12 - 1;
        if (uVar12 != 0) goto LAB_00752631;
        uVar4 = vNodes->nSize;
        goto LAB_00752641;
      }
      pvVar10 = vFront->pArray[uVar8 - 1];
      uVar8 = uVar8 - 1;
    } while (*(uint *)((long)pvVar10 + 8) >> 0xb != uVar12);
    lVar6 = (ulong)uVar7 + 1;
    do {
      if ((int)lVar6 + -1 < 1) {
        __assert_fail("i >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                      ,0x2f6,"void Vec_PtrRemove(Vec_Ptr_t *, void *)");
      }
      lVar9 = lVar6 + -1;
      lVar3 = lVar6 + -2;
      lVar6 = lVar9;
    } while (vFront->pArray[lVar3] != pvVar10);
    for (; (int)lVar9 < (int)uVar7; lVar9 = lVar9 + 1) {
      vFront->pArray[lVar9 + -1] = vFront->pArray[lVar9];
    }
    uVar7 = uVar7 - 1;
    vFront->nSize = uVar7;
    pvVar11 = (void *)(*(ulong *)((long)pvVar10 + 0x10) & 0xfffffffffffffffe);
    if ((*(uint *)((long)pvVar11 + 8) & 0x10) == 0) {
      *(uint *)((long)pvVar11 + 8) = *(uint *)((long)pvVar11 + 8) | 0x10;
      uVar7 = vNodes->nSize;
      if (uVar7 == vNodes->nCap) {
        if ((int)uVar7 < 0x10) {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(vNodes->pArray,0x80);
          }
          vNodes->pArray = ppvVar5;
          vNodes->nCap = 0x10;
        }
        else {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar7 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(vNodes->pArray,(ulong)uVar7 << 4);
          }
          vNodes->pArray = ppvVar5;
          vNodes->nCap = uVar7 * 2;
        }
      }
      else {
        ppvVar5 = vNodes->pArray;
      }
      iVar2 = vNodes->nSize;
      vNodes->nSize = iVar2 + 1;
      ppvVar5[iVar2] = pvVar11;
      uVar7 = vFront->nSize;
      if (uVar7 == vFront->nCap) {
        if ((int)uVar7 < 0x10) {
          if (vFront->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(vFront->pArray,0x80);
          }
          vFront->pArray = ppvVar5;
          vFront->nCap = 0x10;
        }
        else {
          if (vFront->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar7 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(vFront->pArray,(ulong)uVar7 << 4);
          }
          vFront->pArray = ppvVar5;
          vFront->nCap = uVar7 * 2;
        }
      }
      else {
        ppvVar5 = vFront->pArray;
      }
      iVar2 = vFront->nSize;
      uVar7 = iVar2 + 1;
      vFront->nSize = uVar7;
      ppvVar5[iVar2] = pvVar11;
    }
    pvVar10 = (void *)(*(ulong *)((long)pvVar10 + 0x18) & 0xfffffffffffffffe);
    if ((pvVar10 != (void *)0x0) && ((*(uint *)((long)pvVar10 + 8) & 0x10) == 0)) {
      *(uint *)((long)pvVar10 + 8) = *(uint *)((long)pvVar10 + 8) | 0x10;
      uVar7 = vNodes->nSize;
      if (uVar7 == vNodes->nCap) {
        if ((int)uVar7 < 0x10) {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(vNodes->pArray,0x80);
          }
          vNodes->pArray = ppvVar5;
          vNodes->nCap = 0x10;
        }
        else {
          if (vNodes->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar7 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(vNodes->pArray,(ulong)uVar7 << 4);
          }
          vNodes->pArray = ppvVar5;
          vNodes->nCap = uVar7 * 2;
        }
      }
      else {
        ppvVar5 = vNodes->pArray;
      }
      iVar2 = vNodes->nSize;
      vNodes->nSize = iVar2 + 1;
      ppvVar5[iVar2] = pvVar10;
      uVar7 = vFront->nSize;
      if (uVar7 == vFront->nCap) {
        if ((int)uVar7 < 0x10) {
          if (vFront->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc(0x80);
          }
          else {
            ppvVar5 = (void **)realloc(vFront->pArray,0x80);
          }
          vFront->pArray = ppvVar5;
          vFront->nCap = 0x10;
        }
        else {
          if (vFront->pArray == (void **)0x0) {
            ppvVar5 = (void **)malloc((ulong)uVar7 << 4);
          }
          else {
            ppvVar5 = (void **)realloc(vFront->pArray,(ulong)uVar7 << 4);
          }
          vFront->pArray = ppvVar5;
          vFront->nCap = uVar7 * 2;
        }
      }
      else {
        ppvVar5 = vFront->pArray;
      }
      iVar2 = vFront->nSize;
      uVar7 = iVar2 + 1;
      vFront->nSize = uVar7;
      ppvVar5[iVar2] = pvVar10;
    }
LAB_00752631:
    uVar4 = vNodes->nSize;
  } while ((int)uVar4 < nNodeLimit);
LAB_00752641:
  if (1 < (int)uVar4) {
    qsort(vNodes->pArray,(ulong)uVar4,8,Ivy_CompareNodesByLevel);
    uVar4 = vNodes->nSize;
  }
  if ((int)uVar4 < 1) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecPtr.h"
                  ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
  }
  if (*(uint *)((long)vNodes->pArray[(ulong)uVar4 - 1] + 8) >> 0xb <
      *(uint *)((long)*vNodes->pArray + 8) >> 0xb) {
    __assert_fail("pFanin->Level <= pPivot->Level",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/ivy/ivyCutTrav.c"
                  ,0x150,"void Ivy_NodeComputeVolume2(Ivy_Obj_t *, int, Vec_Ptr_t *, Vec_Ptr_t *)");
  }
  lVar6 = 0;
  do {
    pvVar10 = vNodes->pArray[lVar6];
    puVar1 = (uint *)((long)pvVar10 + 8);
    *puVar1 = *puVar1 & 0xffffffef;
    *(int *)((long)pvVar10 + 4) = (int)lVar6;
    lVar6 = lVar6 + 1;
  } while (lVar6 < vNodes->nSize);
  return;
}

Assistant:

void Ivy_NodeComputeVolume2( Ivy_Obj_t * pObj, int nNodeLimit, Vec_Ptr_t * vNodes, Vec_Ptr_t * vFront )
{
    Ivy_Obj_t * pLeaf, * pPivot, * pFanin;
    int LevelMax, i;
    assert( Ivy_ObjIsNode(pObj) );
    // clear arrays
    Vec_PtrClear( vNodes );
    Vec_PtrClear( vFront );
    // add the root
    pObj->fMarkA = 1;
    Vec_PtrPush( vNodes, pObj );
    Vec_PtrPush( vFront, pObj );
    // expand node with maximum level
    LevelMax = pObj->Level;
    do {
        // get the node to expand
        pPivot = NULL;
        Vec_PtrForEachEntryReverse( Ivy_Obj_t *, vFront, pLeaf, i )
        {
            if ( (int)pLeaf->Level == LevelMax )
            {
                pPivot = pLeaf;
                break;
            }
        }
        // decrease level if we did not find the node
        if ( pPivot == NULL )
        {
            if ( --LevelMax == 0 )
                break;
            continue;
        }
        // the node to expand is found
        // remove it from frontier
        Vec_PtrRemove( vFront, pPivot );
        // add fanins
        pFanin = Ivy_ObjFanin0(pPivot); 
        if ( !pFanin->fMarkA )
        {
            pFanin->fMarkA = 1;
            Vec_PtrPush( vNodes, pFanin );
            Vec_PtrPush( vFront, pFanin );
        }
        pFanin = Ivy_ObjFanin1(pPivot); 
        if ( pFanin && !pFanin->fMarkA )
        {
            pFanin->fMarkA = 1;
            Vec_PtrPush( vNodes, pFanin );
            Vec_PtrPush( vFront, pFanin );
        }
        // quit if we collected enough nodes
    } while ( Vec_PtrSize(vNodes) < nNodeLimit );

    // sort nodes by level
    Vec_PtrSort( vNodes, (int (*)(void))Ivy_CompareNodesByLevel );
    // make sure the nodes are ordered in the increasing number of levels
    pFanin = (Ivy_Obj_t *)Vec_PtrEntry( vNodes, 0 );
    pPivot = (Ivy_Obj_t *)Vec_PtrEntryLast( vNodes );
    assert( pFanin->Level <= pPivot->Level );

    // clean the marks and remember node numbers in the TravId
    Vec_PtrForEachEntry( Ivy_Obj_t *, vNodes, pFanin, i )
    {
        pFanin->fMarkA = 0;
        pFanin->TravId = i;
    }
}